

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec * cram_gamma_decode_init(char *data,int size,cram_external_type option,int version)

{
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  char *cp;
  cram_codec *c;
  int version_local;
  cram_external_type option_local;
  int size_local;
  char *data_local;
  
  data_local = (char *)malloc(0x240);
  if (data_local == (char *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    data_local[0] = '\t';
    data_local[1] = '\0';
    data_local[2] = '\0';
    data_local[3] = '\0';
    *(code **)(data_local + 0x18) = cram_gamma_decode;
    *(code **)(data_local + 0x10) = cram_gamma_decode_free;
    if ((byte)*data < 0x80) {
      *(uint *)(data_local + 0x30) = (uint)(byte)*data;
      local_3c = 1;
    }
    else {
      if ((byte)*data < 0xc0) {
        *(uint *)(data_local + 0x30) = CONCAT11(*data,data[1]) & 0x3fff;
        local_40 = 2;
      }
      else {
        if ((byte)*data < 0xe0) {
          *(uint *)(data_local + 0x30) =
               ((byte)*data & 0x1f) << 0x10 | (uint)(byte)data[1] << 8 | (uint)(byte)data[2];
          local_44 = 3;
        }
        else {
          if ((byte)*data < 0xf0) {
            *(uint *)(data_local + 0x30) =
                 ((byte)*data & 0xf) << 0x18 | (uint)(byte)data[1] << 0x10 |
                 (uint)(byte)data[2] << 8 | (uint)(byte)data[3];
            local_48 = 4;
          }
          else {
            *(uint *)(data_local + 0x30) =
                 (uint)(byte)*data << 0x1c | (uint)(byte)data[1] << 0x14 |
                 (uint)(byte)data[2] << 0xc | (uint)(byte)data[3] << 4 | (byte)data[4] & 0xf;
            local_48 = 5;
          }
          local_44 = local_48;
        }
        local_40 = local_44;
      }
      local_3c = local_40;
    }
    if (local_3c != size) {
      fprintf(_stderr,"Malformed gamma header stream\n");
      free(data_local);
      data_local = (char *)0x0;
    }
  }
  return (cram_codec *)data_local;
}

Assistant:

cram_codec *cram_gamma_decode_init(char *data, int size,
				   enum cram_external_type option,
				   int version) {
    cram_codec *c;
    char *cp = data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_GAMMA;
    c->decode = cram_gamma_decode;
    c->free   = cram_gamma_decode_free;
    
    cp += itf8_get(cp, &c->gamma.offset);

    if (cp - data != size) {
	fprintf(stderr, "Malformed gamma header stream\n");
	free(c);
	return NULL;
    }

    return c;
}